

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockUnix.cxx
# Opt level: O1

cmFileLockResult __thiscall cmFileLock::LockWithTimeout(cmFileLock *this,unsigned_long seconds)

{
  int iVar1;
  cmFileLockResult cVar2;
  int *piVar3;
  long lVar4;
  undefined4 local_48 [2];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  local_48[0] = 1;
  iVar1 = fcntl(this->File,6);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    lVar4 = seconds + 1;
    do {
      if ((*piVar3 != 0xb) && (*piVar3 != 0xd)) {
        cVar2 = cmFileLockResult::MakeSystem();
        return cVar2;
      }
      lVar4 = lVar4 + -1;
      if (lVar4 == 0) {
        cVar2 = cmFileLockResult::MakeTimeout();
        return cVar2;
      }
      cmsys::SystemTools::Delay(1000);
      local_40 = 0;
      uStack_38 = 0;
      local_30 = 0;
      local_48[0] = 1;
      iVar1 = fcntl(this->File,6,local_48);
    } while (iVar1 == -1);
  }
  cVar2 = cmFileLockResult::MakeOk();
  return cVar2;
}

Assistant:

cmFileLockResult cmFileLock::LockWithTimeout(unsigned long seconds)
{
  while (true) {
    if (this->LockFile(F_SETLK, F_WRLCK) == -1) {
      if (errno != EACCES && errno != EAGAIN) {
        return cmFileLockResult::MakeSystem();
      }
    } else {
      return cmFileLockResult::MakeOk();
    }
    if (seconds == 0) {
      return cmFileLockResult::MakeTimeout();
    }
    --seconds;
    cmSystemTools::Delay(1000);
  }
}